

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

bool __thiscall
RoboClaw::SpeedAccelDistanceM1M2_2
          (RoboClaw *this,uint32_t accel1,uint32_t speed1,uint32_t distance1,uint32_t accel2,
          uint32_t speed2,uint32_t distance2,uint8_t flag)

{
  bool bVar1;
  
  bVar1 = write_n(this,'\x1b',(ulong)this->m_address,0x33,(ulong)(accel1 >> 0x18),
                  (ulong)(accel1 >> 0x10 & 0xff),(ulong)(accel1 >> 8 & 0xff),(ulong)(accel1 & 0xff),
                  (ulong)(speed1 >> 0x18),(ulong)(speed1 >> 0x10 & 0xff),(ulong)(speed1 >> 8 & 0xff)
                  ,(ulong)(speed1 & 0xff),(ulong)(distance1 >> 0x18),
                  (ulong)(distance1 >> 0x10 & 0xff),(ulong)(distance1 >> 8 & 0xff),
                  (ulong)(distance1 & 0xff),(ulong)(accel2 >> 0x18),(ulong)(accel2 >> 0x10 & 0xff),
                  (ulong)(accel2 >> 8 & 0xff),(ulong)(accel2 & 0xff),(ulong)(speed2 >> 0x18),
                  (ulong)(speed2 >> 0x10 & 0xff),(ulong)(speed2 >> 8 & 0xff),(ulong)(speed2 & 0xff),
                  (ulong)(distance2 >> 0x18),(ulong)(distance2 >> 0x10 & 0xff),
                  (ulong)(distance2 >> 8 & 0xff),(ulong)(distance2 & 0xff),(ulong)flag);
  return bVar1;
}

Assistant:

bool RoboClaw::SpeedAccelDistanceM1M2_2( uint32_t accel1, uint32_t speed1, uint32_t distance1, uint32_t accel2, uint32_t speed2, uint32_t distance2, uint8_t flag)
{
    return write_n(27, m_address, MIXEDSPEED2ACCELDIST,SetDWORDval(accel1),SetDWORDval(speed1),SetDWORDval(distance1),SetDWORDval(accel2),SetDWORDval(speed2),SetDWORDval(distance2),flag);
}